

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoding.cc
# Opt level: O0

string * __thiscall
phosg::rot13_abi_cxx11_(string *__return_storage_ptr__,phosg *this,void *vdata,size_t size)

{
  phosg local_39;
  void *pvStack_38;
  char ch;
  size_t x;
  char *data;
  size_t size_local;
  void *vdata_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (pvStack_38 = (void *)0x0; pvStack_38 < vdata; pvStack_38 = (void *)((long)pvStack_38 + 1)) {
    local_39 = this[(long)pvStack_38];
    if ((((char)local_39 < 'a') || ('m' < (char)local_39)) &&
       (((char)local_39 < 'A' || ('M' < (char)local_39)))) {
      if ((('m' < (char)local_39) && ((char)local_39 < '{')) ||
         (('M' < (char)local_39 && ((char)local_39 < '[')))) {
        local_39 = (phosg)((char)local_39 + -0xd);
      }
    }
    else {
      local_39 = (phosg)((char)local_39 + '\r');
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,(char)local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

string rot13(const void* vdata, size_t size) {
  const char* data = reinterpret_cast<const char*>(vdata);
  string ret;
  for (size_t x = 0; x < size; x++) {
    char ch = data[x];
    if (((ch >= 'a') && (ch <= 'm')) || ((ch >= 'A') && (ch <= 'M'))) {
      ch += 13;
    } else if (((ch >= 'n') && (ch <= 'z')) || ((ch >= 'N') && (ch <= 'Z'))) {
      ch -= 13;
    }
    ret.push_back(ch);
  }
  return ret;
}